

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O0

void re2c::UTF8splitByContinuity(RangeSuffix **root,rune l,rune h,uint32_t n)

{
  uint uVar1;
  uint local_20;
  uint32_t m;
  uint32_t i;
  uint32_t n_local;
  rune h_local;
  rune l_local;
  RangeSuffix **root_local;
  
  local_20 = 1;
  do {
    if (n <= local_20) {
      UTF8addContinuous(root,l,h,n);
      return;
    }
    uVar1 = (1 << ((char)local_20 * '\x06' & 0x1fU)) - 1;
    if ((l & (uVar1 ^ 0xffffffff)) != (h & (uVar1 ^ 0xffffffff))) {
      if ((l & uVar1) != 0) {
        UTF8splitByContinuity(root,l,l | uVar1,n);
        UTF8splitByContinuity(root,(l | uVar1) + 1,h,n);
        return;
      }
      if ((h & uVar1) != uVar1) {
        UTF8splitByContinuity(root,l,(h & (uVar1 ^ 0xffffffff)) - 1,n);
        UTF8splitByContinuity(root,h & (uVar1 ^ 0xffffffff),h,n);
        return;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void UTF8splitByContinuity(RangeSuffix * & root, utf8::rune l, utf8::rune h, uint32_t n)
{
	for (uint32_t i = 1; i < n; ++i)
	{
		uint32_t m = (1u << (6u * i)) - 1u; // last i bytes of a UTF-8 sequence
		if ((l & ~m) != (h & ~m))
		{
			if ((l & m) != 0)
			{
				UTF8splitByContinuity(root, l, l | m, n);
				UTF8splitByContinuity(root, (l | m) + 1, h, n);
				return;
			}
			if ((h & m) != m)
			{
				UTF8splitByContinuity(root, l, (h & ~m) - 1, n);
				UTF8splitByContinuity(root, h & ~m, h, n);
				return;
			}
		}
	}
	UTF8addContinuous(root, l, h, n);
}